

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitparser.cpp
# Opt level: O0

USTATUS __thiscall
FitParser::parseFitEntryAcm
          (FitParser *this,UByteArray *acm,UINT32 localOffset,UModelIndex *parent,CBString *info,
          UINT32 *realSize)

{
  UModelIndex index;
  UModelIndex index_00;
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  int32_t iVar4;
  uint32_t uVar5;
  module_subtype_t mVar6;
  UINT32 UVar7;
  char *p;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  CBString local_5b8;
  string local_5a0;
  CBString local_580;
  string local_568;
  uint local_544;
  undefined1 local_540 [4];
  UINT32 i_1;
  string local_528;
  CBString local_508;
  string local_4f0;
  uint local_4cc;
  undefined1 local_4c8 [4];
  UINT32 i;
  CBString local_4b0;
  CBString local_498;
  CBString local_480;
  undefined8 local_468;
  uint64_t uStack_460;
  TreeModel *local_458;
  CBString local_448;
  CBString local_430;
  undefined1 local_418 [8];
  CBString acmInfo;
  CBString local_3d0;
  header_t *local_3b8;
  header_t *header;
  intel_acm_t parsed;
  kstream ks;
  undefined1 local_1c0 [8];
  umemstream is;
  UINT32 *realSize_local;
  CBString *info_local;
  UModelIndex *parent_local;
  UINT32 localOffset_local;
  UByteArray *acm_local;
  FitParser *this_local;
  
  is._336_8_ = realSize;
  p = UByteArray::constData(acm);
  iVar4 = UByteArray::size(acm);
  umemstream::umemstream((umemstream *)local_1c0,p,(long)iVar4);
  std::istream::seekg((long)local_1c0,localOffset);
  kaitai::kstream::kstream((kstream *)&parsed.m__parent,(istream *)local_1c0);
  intel_acm_t::intel_acm_t
            ((intel_acm_t *)&header,(kstream *)&parsed.m__parent,(kstruct *)0x0,(intel_acm_t *)0x0);
  local_3b8 = intel_acm_t::header((intel_acm_t *)&header);
  uVar5 = intel_acm_t::header_t::module_size(local_3b8);
  *(uint32_t *)is._336_8_ = uVar5;
  uVar5 = intel_acm_t::header_t::header_version(local_3b8);
  if ((uVar5 != 0) && (uVar5 = intel_acm_t::header_t::header_version(local_3b8), uVar5 != 0x30000))
  {
    uVar5 = intel_acm_t::header_t::header_version(local_3b8);
    usprintf(&local_3d0,"%s: Intel ACM with unknown header version %08Xh found","parseFitEntryAcm",
             (ulong)uVar5);
    index.i._4_4_ = (int)(parent->i >> 0x20);
    index._0_12_ = *(undefined1 (*) [12])parent;
    index.m._0_4_ = (int)parent->m;
    index.m._4_4_ = (int)((ulong)parent->m >> 0x20);
    msg(this,&local_3d0,index);
    Bstrlib::CBString::~CBString(&local_3d0);
  }
  uVar5 = intel_acm_t::header_t::entry_point(local_3b8);
  uVar3 = intel_acm_t::header_t::acm_svn(local_3b8);
  bVar1 = intel_acm_t::header_t::date_day(local_3b8);
  intel_acm_t::header_t::date_month(local_3b8);
  intel_acm_t::header_t::date_year(local_3b8);
  usprintf((CBString *)&acmInfo.super_tagbstring.data,
           "LocalOffset: %08Xh, EntryPoint: %08Xh, ACM SVN: %04Xh, Date: %02X.%02X.%04X",
           (ulong)localOffset,(ulong)uVar5,(ulong)uVar3,(ulong)bVar1);
  Bstrlib::CBString::operator=(info,(CBString *)&acmInfo.super_tagbstring.data);
  Bstrlib::CBString::~CBString((CBString *)&acmInfo.super_tagbstring.data);
  Bstrlib::CBString::CBString((CBString *)local_418);
  mVar6 = intel_acm_t::header_t::module_subtype(local_3b8);
  if (mVar6 == MODULE_SUBTYPE_TXT) {
    Bstrlib::CBString::operator=((CBString *)local_418,"TXT ACM ");
  }
  else {
    mVar6 = intel_acm_t::header_t::module_subtype(local_3b8);
    if (mVar6 == MODULE_SUBTYPE_STARTUP) {
      Bstrlib::CBString::operator=((CBString *)local_418,"Startup ACM ");
    }
    else {
      mVar6 = intel_acm_t::header_t::module_subtype(local_3b8);
      if (mVar6 == MODULE_SUBTYPE_BOOT_GUARD) {
        Bstrlib::CBString::operator=((CBString *)local_418,"BootGuard ACM ");
      }
      else {
        mVar6 = intel_acm_t::header_t::module_subtype(local_3b8);
        usprintf(&local_430,"Unknown ACM (%04Xh)",(ulong)mVar6);
        Bstrlib::CBString::operator=((CBString *)local_418,&local_430);
        Bstrlib::CBString::~CBString(&local_430);
        mVar6 = intel_acm_t::header_t::module_subtype(local_3b8);
        usprintf(&local_448,"%s: Intel ACM with unknown subtype %04Xh found","parseFitEntryAcm",
                 (ulong)mVar6);
        local_458 = parent->m;
        local_468._0_4_ = parent->r;
        local_468._4_4_ = parent->c;
        uStack_460 = parent->i;
        index_00.i._4_4_ = (int)(uStack_460 >> 0x20);
        index_00._0_12_ = *(undefined1 (*) [12])parent;
        index_00.m._0_4_ = (int)local_458;
        index_00.m._4_4_ = (int)((ulong)local_458 >> 0x20);
        msg(this,&local_448,index_00);
        Bstrlib::CBString::~CBString(&local_448);
      }
    }
  }
  UVar7 = TreeModel::base(this->model,parent);
  uVar3 = intel_acm_t::header_t::module_type(local_3b8);
  mVar6 = intel_acm_t::header_t::module_subtype(local_3b8);
  uVar5 = intel_acm_t::header_t::header_size(local_3b8);
  intel_acm_t::header_t::header_version(local_3b8);
  intel_acm_t::header_t::chipset_id(local_3b8);
  intel_acm_t::header_t::flags(local_3b8);
  intel_acm_t::header_t::module_vendor(local_3b8);
  intel_acm_t::header_t::date_day(local_3b8);
  intel_acm_t::header_t::date_month(local_3b8);
  intel_acm_t::header_t::date_year(local_3b8);
  intel_acm_t::header_t::module_size(local_3b8);
  intel_acm_t::header_t::acm_svn(local_3b8);
  intel_acm_t::header_t::se_svn(local_3b8);
  intel_acm_t::header_t::code_control_flags(local_3b8);
  intel_acm_t::header_t::error_entry_point(local_3b8);
  intel_acm_t::header_t::gdt_max(local_3b8);
  intel_acm_t::header_t::gdt_base(local_3b8);
  intel_acm_t::header_t::segment_sel(local_3b8);
  intel_acm_t::header_t::entry_point(local_3b8);
  intel_acm_t::header_t::key_size(local_3b8);
  intel_acm_t::header_t::scratch_space_size(local_3b8);
  usprintf(&local_480,
           "found at base %Xh\nModuleType: %04Xh\nModuleSubtype: %04Xh\nHeaderSize: %08Xh\nHeaderVersion: %08Xh\nChipsetId: %04Xh\nFlags: %04Xh\nModuleVendor: %04Xh\nDate: %02X.%02X.%04X\nModuleSize: %08Xh\nAcmSvn: %04Xh\nSeSvn: %04Xh\nCodeControlFlags: %08Xh\nErrorEntryPoint: %08Xh\nGdtMax: %08Xh\nGdtBase: %08Xh\nSegmentSel: %08Xh\nEntryPoint: %08Xh\nKeySize: %08Xh\nScratchSpaceSize: %08Xh\n"
           ,(ulong)(UVar7 + localOffset),(ulong)uVar3,(ulong)mVar6,(ulong)(uVar5 << 2));
  Bstrlib::CBString::operator+=((CBString *)local_418,&local_480);
  Bstrlib::CBString::~CBString(&local_480);
  bVar2 = intel_acm_t::header_t::_is_null_rsa_exponent(local_3b8);
  if (bVar2) {
    usprintf(&local_4b0,"ACM RSA Public Key Exponent: %Xh\n",0x10001);
    Bstrlib::CBString::operator+=((CBString *)local_418,&local_4b0);
    Bstrlib::CBString::~CBString(&local_4b0);
  }
  else {
    uVar5 = intel_acm_t::header_t::rsa_exponent(local_3b8);
    usprintf(&local_498,"ACM RSA Public Key Exponent: %Xh\n",(ulong)uVar5);
    Bstrlib::CBString::operator+=((CBString *)local_418,&local_498);
    Bstrlib::CBString::~CBString(&local_498);
  }
  usprintf((CBString *)local_4c8,"ACM RSA Public Key:");
  Bstrlib::CBString::operator+=((CBString *)local_418,(CBString *)local_4c8);
  Bstrlib::CBString::~CBString((CBString *)local_4c8);
  local_4cc = 0;
  while( true ) {
    uVar8 = (ulong)local_4cc;
    intel_acm_t::header_t::rsa_public_key_abi_cxx11_(&local_4f0,local_3b8);
    uVar9 = std::__cxx11::string::size();
    std::__cxx11::string::~string((string *)&local_4f0);
    if (uVar9 <= uVar8) break;
    if ((local_4cc & 0x1f) == 0) {
      Bstrlib::CBString::operator+=((CBString *)local_418,"\n");
    }
    intel_acm_t::header_t::rsa_public_key_abi_cxx11_(&local_528,local_3b8);
    pbVar10 = (byte *)std::__cxx11::string::at((ulong)&local_528);
    usprintf(&local_508,"%02X",(ulong)*pbVar10);
    Bstrlib::CBString::operator+=((CBString *)local_418,&local_508);
    Bstrlib::CBString::~CBString(&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    local_4cc = local_4cc + 1;
  }
  Bstrlib::CBString::operator+=((CBString *)local_418,"\n");
  Bstrlib::CBString::CBString((CBString *)local_540,"ACM RSA Signature:");
  Bstrlib::CBString::operator+=((CBString *)local_418,(CBString *)local_540);
  Bstrlib::CBString::~CBString((CBString *)local_540);
  local_544 = 0;
  while( true ) {
    uVar8 = (ulong)local_544;
    intel_acm_t::header_t::rsa_signature_abi_cxx11_(&local_568,local_3b8);
    uVar9 = std::__cxx11::string::size();
    std::__cxx11::string::~string((string *)&local_568);
    if (uVar9 <= uVar8) break;
    if ((local_544 & 0x1f) == 0) {
      Bstrlib::CBString::operator+=((CBString *)local_418,"\n");
    }
    intel_acm_t::header_t::rsa_signature_abi_cxx11_(&local_5a0,local_3b8);
    pbVar10 = (byte *)std::__cxx11::string::at((ulong)&local_5a0);
    usprintf(&local_580,"%02X",(ulong)*pbVar10);
    Bstrlib::CBString::operator+=((CBString *)local_418,&local_580);
    Bstrlib::CBString::~CBString(&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    local_544 = local_544 + 1;
  }
  Bstrlib::CBString::operator+=((CBString *)local_418,"\n");
  Bstrlib::CBString::operator+(&local_5b8,(CBString *)local_418,"\n");
  Bstrlib::CBString::operator+=(&this->securityInfo,&local_5b8);
  Bstrlib::CBString::~CBString(&local_5b8);
  this->bgAcmFound = true;
  Bstrlib::CBString::~CBString((CBString *)local_418);
  intel_acm_t::~intel_acm_t((intel_acm_t *)&header);
  kaitai::kstream::~kstream((kstream *)&parsed.m__parent);
  umemstream::~umemstream((umemstream *)local_1c0);
  return 0;
}

Assistant:

USTATUS FitParser::parseFitEntryAcm(const UByteArray & acm, const UINT32 localOffset, const UModelIndex & parent, UString & info, UINT32 &realSize)
{
    try {
        umemstream is(acm.constData(), acm.size());
        is.seekg(localOffset, is.beg);
        kaitai::kstream ks(&is);
        intel_acm_t parsed(&ks);
        intel_acm_t::header_t* header = parsed.header();
        
        realSize = header->module_size();
        
        // Check header version to be of a known value
        if (header->header_version() != intel_acm_t::KNOWN_HEADER_VERSION_V0_0
            && header->header_version() != intel_acm_t::KNOWN_HEADER_VERSION_V3_0) {
            msg(usprintf("%s: Intel ACM with unknown header version %08Xh found", __FUNCTION__, header->header_version()), parent);
        }
        
        // Valid ACM found
        info = usprintf("LocalOffset: %08Xh, EntryPoint: %08Xh, ACM SVN: %04Xh, Date: %02X.%02X.%04X",
                        localOffset,
                        header->entry_point(),
                        header->acm_svn(),
                        header->date_day(),
                        header->date_month(),
                        header->date_year());
        
        // Populate ACM info
        UString acmInfo;
        if (header->module_subtype() == intel_acm_t::MODULE_SUBTYPE_TXT) {
            acmInfo = "TXT ACM ";
        }
        else if(header->module_subtype() == intel_acm_t::MODULE_SUBTYPE_STARTUP) {
            acmInfo = "Startup ACM ";
        }
        else if (header->module_subtype() == intel_acm_t::MODULE_SUBTYPE_BOOT_GUARD) {
            acmInfo = "BootGuard ACM ";
        }
        else {
            acmInfo = usprintf("Unknown ACM (%04Xh)", header->module_subtype());
            msg(usprintf("%s: Intel ACM with unknown subtype %04Xh found", __FUNCTION__, header->module_subtype()), parent);
        }
        
        acmInfo += usprintf("found at base %Xh\n"
                            "ModuleType: %04Xh\n"
                            "ModuleSubtype: %04Xh\n"
                            "HeaderSize: %08Xh\n"
                            "HeaderVersion: %08Xh\n"
                            "ChipsetId: %04Xh\n"
                            "Flags: %04Xh\n"
                            "ModuleVendor: %04Xh\n"
                            "Date: %02X.%02X.%04X\n"
                            "ModuleSize: %08Xh\n"
                            "AcmSvn: %04Xh\n"
                            "SeSvn: %04Xh\n"
                            "CodeControlFlags: %08Xh\n"
                            "ErrorEntryPoint: %08Xh\n"
                            "GdtMax: %08Xh\n"
                            "GdtBase: %08Xh\n"
                            "SegmentSel: %08Xh\n"
                            "EntryPoint: %08Xh\n"
                            "KeySize: %08Xh\n"
                            "ScratchSpaceSize: %08Xh\n",
                            model->base(parent) + localOffset,
                            header->module_type(),
                            header->module_subtype(),
                            header->header_size() * (UINT32)sizeof(UINT32),
                            header->header_version(),
                            header->chipset_id(),
                            header->flags(),
                            header->module_vendor(),
                            header->date_day(), header->date_month(), header->date_year(),
                            header->module_size() * (UINT32)sizeof(UINT32),
                            header->acm_svn(),
                            header->se_svn(),
                            header->code_control_flags(),
                            header->error_entry_point(),
                            header->gdt_max(),
                            header->gdt_base(),
                            header->segment_sel(),
                            header->entry_point(),
                            header->key_size() * (UINT32)sizeof(UINT32),
                            header->scratch_space_size() * (UINT32)sizeof(UINT32));
        
        // Add RsaPublicKey
        if (header->_is_null_rsa_exponent() == false) {
            acmInfo += usprintf("ACM RSA Public Key Exponent: %Xh\n", header->rsa_exponent());
        }
        else {
            acmInfo += usprintf("ACM RSA Public Key Exponent: %Xh\n", INTEL_ACM_HARDCODED_RSA_EXPONENT);
        }
        acmInfo += usprintf("ACM RSA Public Key:");
        for (UINT32 i = 0; i < header->rsa_public_key().size(); i++) {
            if (i % 32 == 0) acmInfo += "\n";
            acmInfo += usprintf("%02X", (UINT8)header->rsa_public_key().at(i));
        }
        acmInfo += "\n";
        
        // Add RsaSignature
        acmInfo += UString("ACM RSA Signature:");
        for (UINT32 i = 0; i < header->rsa_signature().size(); i++) {
            if (i % 32 == 0) acmInfo +="\n";
            acmInfo += usprintf("%02X", (UINT8)header->rsa_signature().at(i));
        }
        acmInfo += "\n";
        
        securityInfo += acmInfo + "\n";
        bgAcmFound = true;
        return U_SUCCESS;
    }
    catch (...) {
        msg(usprintf("%s: unable to parse ACM", __FUNCTION__), parent);
        return U_INVALID_ACM;
    }
}